

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

Bigint * lshift(Bigint *b,int k)

{
  uint32 *puVar1;
  sbyte sVar2;
  int iVar3;
  Bigint *pBVar4;
  uint uVar5;
  int k_00;
  uint32 *__s;
  uint32 *puVar6;
  ulong uVar7;
  int iVar8;
  
  pBVar4 = b;
  if (b->wds != 1 || b->x[0] != 0) {
    k_00 = b->k;
    iVar8 = b->wds + ((uint)k >> 5);
    for (iVar3 = b->maxwds; iVar3 <= iVar8; iVar3 = iVar3 * 2) {
      k_00 = k_00 + 1;
    }
    pBVar4 = Balloc(k_00);
    if (pBVar4 == (Bigint *)0x0) {
      pBVar4 = (Bigint *)0x0;
    }
    else {
      puVar6 = b->x;
      __s = pBVar4->x;
      if (0x1f < (uint)k) {
        uVar7 = (ulong)(((uint)k >> 5) - 1);
        memset(__s,0,uVar7 * 4 + 4);
        __s = pBVar4->x + uVar7 + 1;
      }
      puVar1 = puVar6 + b->wds;
      if ((k & 0x1fU) == 0) {
        do {
          uVar5 = *puVar6;
          puVar6 = puVar6 + 1;
          *__s = uVar5;
          __s = __s + 1;
        } while (puVar6 < puVar1);
      }
      else {
        sVar2 = (sbyte)(k & 0x1fU);
        uVar5 = 0;
        do {
          *__s = *puVar6 << sVar2 | uVar5;
          __s = __s + 1;
          uVar5 = *puVar6;
          puVar6 = puVar6 + 1;
          uVar5 = uVar5 >> (0x20U - sVar2 & 0x1f);
        } while (puVar6 < puVar1);
        *__s = uVar5;
        iVar8 = (iVar8 + 1) - (uint)(uVar5 == 0);
      }
      pBVar4->wds = iVar8;
    }
    if (b != (Bigint *)0x0) {
      ckd_free(b);
    }
  }
  return pBVar4;
}

Assistant:

static Bigint *
lshift(Bigint *b, int k)
{
    int i, k1, n, n1;
    Bigint *b1;
    ULong *x, *x1, *xe, z;

    if (!k || (!b->x[0] && b->wds == 1))
        return b;

    n = k >> 5;
    k1 = b->k;
    n1 = n + b->wds + 1;
    for(i = b->maxwds; n1 > i; i <<= 1)
        k1++;
    b1 = Balloc(k1);
    if (b1 == NULL) {
        Bfree(b);
        return NULL;
    }
    x1 = b1->x;
    for(i = 0; i < n; i++)
        *x1++ = 0;
    x = b->x;
    xe = x + b->wds;
    if (k &= 0x1f) {
        k1 = 32 - k;
        z = 0;
        do {
            *x1++ = *x << k | z;
            z = *x++ >> k1;
        }
        while(x < xe);
        if ((*x1 = z))
            ++n1;
    }
    else do
             *x1++ = *x++;
        while(x < xe);
    b1->wds = n1 - 1;
    Bfree(b);
    return b1;
}